

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

void avro::parsing::SimpleParser<avro::parsing::JsonHandler>::throwMismatch
               (Kind expected,Kind actual)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 *puVar3;
  ostringstream oss;
  string asStack_1b8 [32];
  ostream local_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_198,"Invalid operation. Expected: ",0x1d);
  pcVar1 = *(char **)(Symbol::stringValues + (ulong)expected * 8);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)asStack_1b8 + (int)local_198._vptr_basic_ostream[-3] + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(&local_198,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_198," got ",5);
  pcVar1 = *(char **)(Symbol::stringValues + (ulong)actual * 8);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)asStack_1b8 + (int)local_198._vptr_basic_ostream[-3] + 0x20);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(&local_198,pcVar1,sVar2);
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),asStack_1b8);
  *puVar3 = 0x1cc910;
  puVar3[1] = 0x1cc940;
  __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void throwMismatch(Symbol::Kind expected, Symbol::Kind actual)
    {
        std::ostringstream oss;
        oss << "Invalid operation. Expected: " <<
            Symbol::toString(expected) << " got " <<
            Symbol::toString(actual);
        throw Exception(oss.str());
    }